

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_name_formatter.cpp
# Opt level: O0

ImageNameFormatter * __thiscall
dpfb::ImageNameFormatter::getImageName_abi_cxx11_(ImageNameFormatter *this,size_t imageIdx)

{
  ulong uVar1;
  undefined8 in_RDX;
  string local_78 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [39];
  undefined1 local_21;
  undefined8 local_20;
  size_t imageIdx_local;
  ImageNameFormatter *this_local;
  string *result;
  
  local_21 = 0;
  local_20 = in_RDX;
  imageIdx_local = imageIdx;
  this_local = this;
  std::__cxx11::string::string((string *)this);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+(local_48,(char)imageIdx);
    std::__cxx11::string::operator+=((string *)this,(string *)local_48);
    std::__cxx11::string::~string((string *)local_48);
  }
  str::format_abi_cxx11_((char *)local_78,"%0*zu",(ulong)*(uint *)(imageIdx + 0x20),local_20);
  std::__cxx11::string::operator+=((string *)this,local_78);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::operator+=((string *)this,(string *)(imageIdx + 0x28));
  return this;
}

Assistant:

std::string ImageNameFormatter::getImageName(std::size_t imageIdx) const
{
    std::string result;

    if (!prefix.empty())
        result += prefix + '_';

    result += str::format("%0*zu", numDigits, imageIdx);
    result += extension;

    return result;
}